

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_buildCTable_wksp
                 (HUF_CElt *CTable,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  short *psVar1;
  byte bVar2;
  byte bVar3;
  HUF_CElt *pHVar4;
  uint uVar5;
  undefined4 *__s;
  long lVar6;
  char *pcVar7;
  byte *pbVar8;
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  short sVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  size_t sVar30;
  nodeElt *huffNode0;
  int iVar31;
  HUF_CElt *elt;
  U16 nbPerRank [13];
  undefined4 local_bc;
  uint local_b8 [2];
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  undefined2 local_a8;
  undefined6 uStack_a6;
  undefined2 uStack_a0;
  undefined6 uStack_9e;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong local_78;
  ulong local_70;
  HUF_CElt *local_68;
  undefined8 local_60;
  ushort auStack_58 [16];
  ulong local_38;
  
  local_38 = wkspSize;
  __s = (undefined4 *)HUF_alignUpWorkspace(workSpace,&local_38,4);
  sVar30 = 0xffffffffffffffbe;
  if ((0x12ff < local_38) && (sVar30 = 0xffffffffffffffd2, maxSymbolValue < 0x100)) {
    uVar23 = (ulong)(maxSymbolValue + 1);
    uVar18 = 0;
    local_68 = CTable;
    memset(__s,0,0x1300);
    do {
      uVar16 = count[uVar18];
      uVar20 = 0x1f;
      if (uVar16 != 0) {
        for (; uVar16 >> uVar20 == 0; uVar20 = uVar20 - 1) {
        }
      }
      uVar20 = (uVar20 ^ 0xffffffe0) + 0xbe;
      if (uVar16 < 0xa5) {
        uVar20 = uVar16;
      }
      *(short *)(__s + (ulong)uVar20 + 0x400) = *(short *)(__s + (ulong)uVar20 + 0x400) + 1;
      uVar18 = uVar18 + 1;
    } while (uVar23 != uVar18);
    uVar16 = 0xb;
    if (maxNbBits != 0) {
      uVar16 = maxNbBits;
    }
    if (*(short *)(__s + 0x4bf) != 0) {
      __assert_fail("rankPosition[RANK_POSITION_TABLE_SIZE - 1].base == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x264,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
    }
    lVar6 = 0x4be;
    do {
      sVar24 = *(short *)(__s + lVar6);
      *(short *)(__s + lVar6) = sVar24 + *(short *)(__s + lVar6 + 1);
      *(short *)((long)__s + lVar6 * 4 + 2) = sVar24 + *(short *)(__s + lVar6 + 1);
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0x3ff);
    uVar18 = 0;
    do {
      uVar20 = count[uVar18];
      uVar21 = 0x1f;
      if (uVar20 != 0) {
        for (; uVar20 >> uVar21 == 0; uVar21 = uVar21 - 1) {
        }
      }
      uVar21 = (uVar21 ^ 0xffffffe0) + 0xbe;
      if (uVar20 < 0xa5) {
        uVar21 = uVar20;
      }
      uVar10 = *(ushort *)((long)__s + (ulong)uVar21 * 4 + 0x1006);
      *(ushort *)((long)__s + (ulong)uVar21 * 4 + 0x1006) = uVar10 + 1;
      if ((ushort)maxSymbolValue < uVar10) {
        __assert_fail("pos < maxSymbolValue1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                      ,0x270,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)")
        ;
      }
      __s[(ulong)uVar10 * 2 + 2] = uVar20;
      *(char *)((long)__s + (ulong)uVar10 * 8 + 0xe) = (char)uVar18;
      uVar18 = uVar18 + 1;
    } while (uVar23 != uVar18);
    lVar6 = 0x4a5;
    do {
      uVar10 = *(ushort *)(__s + lVar6);
      iVar15 = (uint)*(ushort *)((long)__s + lVar6 * 4 + 2) - (uint)uVar10;
      if (1 < iVar15) {
        if (maxSymbolValue < uVar10) {
          __assert_fail("bucketStartIdx < maxSymbolValue1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                        ,0x27a,
                        "void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
        }
        HUF_simpleQuickSort((nodeElt *)(__s + (ulong)uVar10 * 2 + 2),0,iVar15 + -1);
      }
      pHVar4 = local_68;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x4bf);
    if (maxSymbolValue != 0) {
      uVar18 = 1;
      do {
        if ((uint)__s[uVar18 * 2] < (uint)__s[uVar18 * 2 + 2]) {
          __assert_fail("HUF_isSorted(huffNode, maxSymbolValue1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                        ,0x27f,
                        "void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
        }
        uVar18 = uVar18 + 1;
      } while (uVar23 != uVar18);
    }
    local_78 = (ulong)maxSymbolValue;
    lVar19 = (local_78 << 0x20) + 0x10000000000;
    lVar22 = (local_78 << 0x20) + 0x100000000;
    lVar6 = 0;
    do {
      lVar27 = lVar6 * 2;
      lVar6 = lVar6 + -1;
      lVar19 = lVar19 + -0x100000000;
      lVar22 = lVar22 + -0x100000000;
    } while (__s[local_78 * 2 + lVar27 + 2] == 0);
    __s[0x202] = __s[local_78 * 2 + lVar27 + 2] + __s[local_78 * 2 + lVar6 * 2 + 2];
    *(undefined2 *)(__s + local_78 * 2 + lVar6 * 2 + 3) = 0x100;
    *(undefined2 *)(__s + local_78 * 2 + lVar6 * 2 + 5) = 0x100;
    uVar25 = local_78 + lVar6 + 1;
    uVar18 = local_78 + lVar6 + 0x100;
    local_70 = uVar25;
    if ((long)uVar25 < 2) {
      *__s = 0x80000000;
    }
    else {
      uVar14 = (ulong)(maxSymbolValue - 1) + lVar6;
      uVar12 = 0x101;
      if (0x101 < (int)uVar18) {
        uVar12 = uVar18 & 0xffffffff;
      }
      uVar13 = 0x100;
      do {
        __s[uVar13 * 2 + 4] = 0x40000000;
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
      *__s = 0x80000000;
      if (1 < (long)uVar25) {
        uVar12 = 0x101;
        if (0x101 < (int)uVar18) {
          uVar12 = uVar18 & 0xffffffff;
        }
        local_60 = uVar12 - 0x100;
        iVar15 = 0x100;
        lVar27 = 0;
        do {
          iVar31 = (int)uVar14;
          uVar20 = __s[(long)iVar31 * 2 + 2];
          uVar21 = __s[(long)iVar15 * 2 + 2];
          iVar29 = (iVar15 + 1) - (uint)(uVar20 < uVar21);
          iVar26 = iVar15;
          if (uVar20 < uVar21) {
            iVar26 = iVar31;
          }
          uVar5 = (uint)(uVar20 < uVar21);
          iVar17 = iVar31 - uVar5;
          uVar20 = __s[(long)iVar17 * 2 + 2];
          uVar21 = __s[(long)iVar29 * 2 + 2];
          iVar15 = (iVar29 + 1) - (uint)(uVar20 < uVar21);
          uVar14 = (ulong)((iVar31 - uVar5) - (uint)(uVar20 < uVar21));
          if (uVar20 < uVar21) {
            iVar29 = iVar17;
          }
          __s[lVar27 * 2 + 0x204] = __s[(long)iVar29 * 2 + 2] + __s[(long)iVar26 * 2 + 2];
          sVar24 = (short)lVar27 + 0x101;
          *(short *)(__s + (long)iVar29 * 2 + 3) = sVar24;
          *(short *)(__s + (long)iVar26 * 2 + 3) = sVar24;
          lVar27 = lVar27 + 1;
        } while (uVar12 - 0x100 != lVar27);
      }
    }
    *(undefined1 *)((long)__s + (lVar19 >> 0x1d) + 0xf) = 0;
    if (1 < (long)uVar25) {
      pcVar7 = (char *)((long)__s + (ulong)(maxSymbolValue + (int)lVar6 + 0xff) * 8 + 0xf);
      do {
        *pcVar7 = *(char *)((long)__s + (ulong)*(ushort *)(pcVar7 + -3) * 8 + 0xf) + '\x01';
        uVar20 = (int)uVar18 - 1;
        uVar18 = (ulong)uVar20;
        pcVar7 = pcVar7 + -8;
      } while (0x100 < (int)uVar20);
    }
    uVar18 = local_78 + lVar6 + 2;
    if (-1 < (long)uVar25) {
      uVar12 = 0;
      do {
        *(char *)((long)__s + uVar12 * 8 + 0xf) =
             *(char *)((long)__s + (ulong)*(ushort *)(__s + uVar12 * 2 + 3) * 8 + 0xf) + '\x01';
        uVar12 = uVar12 + 1;
      } while ((uVar18 & 0xffffffff) != uVar12);
    }
    bVar2 = *(byte *)((long)__s + (uVar25 & 0xffffffff) * 8 + 0xf);
    iVar15 = bVar2 - uVar16;
    uVar20 = (uint)bVar2;
    local_bc = uVar16;
    if (uVar16 <= bVar2 && iVar15 != 0) {
      bVar9 = (byte)iVar15;
      iVar15 = 1 << (bVar9 & 0x1f);
      bVar3 = *(byte *)((long)__s + (lVar22 >> 0x1d) + 0xf);
      uVar20 = (uint)bVar3;
      uVar21 = 0;
      uVar12 = uVar25;
      if (uVar16 < bVar3) {
        uVar12 = lVar22 >> 0x20;
        uVar21 = 0;
        do {
          uVar21 = uVar21 + iVar15 + (-1 << (bVar2 - (char)uVar20 & 0x1f));
          *(char *)((long)__s + uVar12 * 8 + 0xf) = (char)uVar16;
          uVar20 = (uint)*(byte *)((long)__s + uVar12 * 8 + 7);
          uVar12 = uVar12 - 1;
        } while (uVar16 < uVar20);
      }
      uVar12 = (long)(int)uVar12 + 1;
      do {
        lVar6 = uVar12 * 8;
        uVar12 = uVar12 - 1;
      } while (uVar16 == *(byte *)((long)__s + lVar6 + 7));
      if ((uVar21 & iVar15 - 1U) != 0) {
        __assert_fail("((U32)totalCost & (baseCost - 1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                      ,0x17c,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
      }
      uVar21 = (int)uVar21 >> (bVar9 & 0x1f);
      if ((int)uVar21 < 1) {
        __assert_fail("totalCost > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                      ,0x17e,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
      }
      local_88 = 0xf0f0f0f0f0f0f0f0;
      local_98 = 0xf0f0f0f0f0f0f0f0;
      uStack_90 = 0xf0f0f0f0f0f0f0f0;
      local_a8 = 0xf0f0;
      uStack_a6 = 0xf0f0f0f0f0f0;
      uStack_a0 = 0xf0f0;
      uStack_9e = 0xf0f0f0f0f0f0;
      local_b8[0] = 0xf0f0f0f0;
      local_b8[1] = 0xf0f0f0f0;
      uStack_b0 = 0xf0f0;
      uStack_ae = 0xf0f0f0f0f0f0;
      if (-1 < (long)uVar12) {
        pbVar8 = (byte *)((long)__s + (uVar12 & 0xffffffff) * 8 + 0xf);
        uVar14 = uVar12 & 0xffffffff;
        uVar20 = uVar16;
        do {
          uVar5 = (uint)uVar14;
          if (*pbVar8 < uVar20) {
            uVar20 = (uint)*pbVar8;
            local_b8[uVar16 - uVar20] = uVar5;
          }
          pbVar8 = pbVar8 + -8;
          uVar14 = (ulong)(uVar5 - 1);
        } while (0 < (int)uVar5);
      }
      do {
        uVar20 = 0x1f;
        if (uVar21 != 0) {
          for (; uVar21 >> uVar20 == 0; uVar20 = uVar20 - 1) {
          }
        }
        uVar5 = 0x20 - (uVar20 ^ 0x1f);
        if ((uVar20 ^ 0x1f) != 0x1f) {
          uVar14 = (ulong)uVar5;
          do {
            uVar13 = uVar14 - 1;
            if (((ulong)local_b8[uVar14] != 0xf0f0f0f0) &&
               ((local_b8[uVar13 & 0xffffffff] == 0xf0f0f0f0 ||
                ((uint)__s[(ulong)local_b8[uVar14] * 2 + 2] <=
                 (uint)(__s[(ulong)local_b8[uVar13 & 0xffffffff] * 2 + 2] * 2)))))
            goto LAB_0021a038;
            uVar5 = uVar5 - 1;
            uVar14 = uVar13;
          } while ((uVar13 & 0xfffffffe) != 0);
          uVar5 = 1;
        }
LAB_0021a038:
        uVar14 = (ulong)uVar5;
        if ((uVar5 != 1) && (local_b8[uVar14] == 0xf0f0f0f0)) {
          __assert_fail("rankLast[nBitsToDecrease] != noSymbol || nBitsToDecrease == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                        ,0x1a0,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
        }
        if (uVar5 < 0xd) {
          do {
            if (local_b8[uVar14] != 0xf0f0f0f0) {
              uVar5 = (uint)uVar14;
              goto LAB_0021a06e;
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0xd);
          uVar5 = 0xd;
        }
LAB_0021a06e:
        uVar20 = local_b8[uVar5];
        uVar14 = (ulong)uVar20;
        if (uVar14 == 0xf0f0f0f0) {
          __assert_fail("rankLast[nBitsToDecrease] != noSymbol",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                        ,0x1a4,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
        }
        uVar11 = uVar5 - 1;
        pcVar7 = (char *)((long)__s + uVar14 * 8 + 0xf);
        *pcVar7 = *pcVar7 + '\x01';
        uVar28 = uVar20;
        if (local_b8[uVar11] != 0xf0f0f0f0) {
          uVar28 = local_b8[uVar11];
        }
        local_b8[uVar11] = uVar28;
        if (uVar14 == 0) {
          uVar28 = 0xf0f0f0f0;
        }
        else {
          uVar20 = uVar20 - 1;
          local_b8[uVar5] = uVar20;
          uVar28 = 0xf0f0f0f0;
          if (uVar16 - uVar5 == (uint)*(byte *)((long)__s + (ulong)uVar20 * 8 + 0xf)) {
            uVar28 = uVar20;
          }
        }
        uVar21 = uVar21 + (-1 << ((byte)uVar11 & 0x1f));
        local_b8[uVar5] = uVar28;
      } while (0 < (int)uVar21);
      uVar20 = uVar16;
      if ((int)uVar21 < 0) {
        uVar5 = local_b8[1];
        do {
          uVar28 = 0xffffffff;
          if (-1 < (int)uVar21) {
            uVar28 = uVar21;
          }
          iVar15 = 0;
          while (uVar5 + iVar15 != -0xf0f0f10) {
            pcVar7 = (char *)((long)__s + (ulong)(iVar15 + uVar5 + 1) * 8 + 0xf);
            *pcVar7 = *pcVar7 + -1;
            iVar15 = iVar15 + 1;
            if (~uVar28 + uVar21 + iVar15 == 0) goto LAB_0021a163;
          }
          iVar29 = (int)uVar12;
          iVar26 = uVar21 + iVar15;
          uVar12 = (long)iVar29 + 1;
          uVar5 = iVar29 + 2;
          do {
            lVar6 = uVar12 * 8;
            uVar12 = uVar12 - 1;
            uVar5 = uVar5 + -1;
          } while (uVar16 == *(byte *)((long)__s + lVar6 + 7));
          pcVar7 = (char *)((long)__s + (long)(int)uVar5 * 8 + 0xf);
          *pcVar7 = *pcVar7 + -1;
          if ((long)uVar12 < 0) {
            local_b8[1] = 0xf0f0f0f0;
            __assert_fail("n >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                          ,0x1cc,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
          }
          uVar21 = uVar21 + iVar15 + 1;
        } while (iVar26 < -1);
      }
    }
LAB_0021a163:
    sVar30 = 0xffffffffffffffff;
    if (uVar20 < 0xd) {
      local_a8 = 0;
      uStack_a6 = 0;
      uStack_a0 = 0;
      local_b8[0] = 0;
      local_b8[1] = 0;
      uStack_b0 = 0;
      uStack_ae = 0;
      auStack_58[8] = 0;
      auStack_58[9] = 0;
      auStack_58[10] = 0;
      auStack_58[0xb] = 0;
      auStack_58[0xc] = 0;
      auStack_58[0] = 0;
      auStack_58[1] = 0;
      auStack_58[2] = 0;
      auStack_58[3] = 0;
      auStack_58[4] = 0;
      auStack_58[5] = 0;
      auStack_58[6] = 0;
      auStack_58[7] = 0;
      if (-1 < (long)uVar25) {
        uVar25 = 0;
        do {
          psVar1 = (short *)((long)local_b8 + (ulong)*(byte *)((long)__s + uVar25 * 8 + 0xf) * 2);
          *psVar1 = *psVar1 + 1;
          uVar25 = uVar25 + 1;
        } while ((uVar18 & 0xffffffff) != uVar25);
      }
      sVar30 = (size_t)uVar20;
      if (uVar20 != 0) {
        lVar6 = sVar30 + 1;
        uVar10 = 0;
        do {
          *(ushort *)((long)&local_60 + lVar6 * 2 + 6) = uVar10;
          uVar10 = (ushort)(uVar10 + *(short *)((long)&local_bc + lVar6 * 2 + 2)) >> 1;
          lVar6 = lVar6 + -1;
        } while (1 < lVar6);
      }
      elt = pHVar4 + 1;
      uVar18 = 0;
      do {
        uVar25 = (ulong)*(byte *)((long)__s + uVar18 * 8 + 0xf);
        if (0xc < uVar25) {
          __assert_fail("nbBits <= HUF_TABLELOG_ABSOLUTEMAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                        ,0xd2,"void HUF_setNbBits(HUF_CElt *, size_t)");
        }
        elt[*(byte *)((long)__s + uVar18 * 8 + 0xe)] = uVar25;
        uVar18 = uVar18 + 1;
      } while (uVar23 != uVar18);
      do {
        uVar10 = auStack_58[(byte)*elt];
        auStack_58[(byte)*elt] = uVar10 + 1;
        HUF_setValue(elt,(ulong)uVar10);
        elt = elt + 1;
        uVar23 = uVar23 - 1;
      } while (uVar23 != 0);
      *pHVar4 = sVar30;
    }
  }
  return sVar30;
}

Assistant:

size_t
HUF_buildCTable_wksp(HUF_CElt* CTable, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits,
                     void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables =
        (HUF_buildCTable_wksp_tables*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(U32));
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE == sizeof(HUF_buildCTable_wksp_tables));

    DEBUGLOG(5, "HUF_buildCTable_wksp (alphabet size = %u)", maxSymbolValue+1);

    /* safety checks */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
        return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
        return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);
    DEBUGLOG(6, "sorted symbols completed (%zu symbols)", showHNodeSymbols(huffNode, maxSymbolValue+1));

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* determine and enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(CTable, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}